

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseSimpleSelector(Parser *this,BasicSelector *basicSel)

{
  bool bVar1;
  bool bVar2;
  Parser *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  int count;
  bool onceMore;
  int minCount;
  QString theid;
  Pseudo ps;
  AttributeSelector a_1;
  AttributeSelector a;
  parameter_type in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  TokenType in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  uint uVar4;
  Parser *in_stack_fffffffffffffef8;
  int local_f4;
  int local_ec;
  byte local_d1;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [64];
  undefined1 local_78 [56];
  QString local_40 [2];
  undefined4 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_ec = 0;
  bVar1 = lookupElementName((Parser *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
  ;
  if (bVar1) {
    bVar1 = parseElementName(in_stack_fffffffffffffef8,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (!bVar1) {
      local_d1 = 0;
      goto LAB_00a3c677;
    }
  }
  else {
    prev(in_RDI);
    local_ec = 1;
  }
  local_f4 = 0;
  while( true ) {
    bVar1 = false;
    bVar2 = test(in_RDI,in_stack_fffffffffffffee4);
    if (bVar2) {
      local_d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      lexem(in_RDI);
      QString::remove((longlong)&local_d0,0);
      QList<QString>::append
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (parameter_type)in_stack_fffffffffffffed8);
      bVar1 = true;
      QString::~QString((QString *)0xa3c433);
    }
    else {
      bVar2 = testClass((Parser *)0xa3c442);
      if (bVar2) {
        bVar1 = true;
        memset(local_40,0xaa,0x38);
        AttributeSelector::AttributeSelector
                  ((AttributeSelector *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        QVar3 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_RDI,
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        QString::operator=(local_40,(QLatin1String *)QVar3.m_size);
        local_10 = 2;
        bVar2 = parseClass(in_RDI,(QString *)
                                  CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        if (bVar2) {
          QList<QCss::AttributeSelector>::append
                    ((QList<QCss::AttributeSelector> *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     (parameter_type)in_stack_fffffffffffffed8);
        }
        else {
          local_d1 = 0;
        }
        uVar4 = (uint)!bVar2;
        AttributeSelector::~AttributeSelector
                  ((AttributeSelector *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
        if (uVar4 != 0) goto LAB_00a3c677;
        in_stack_fffffffffffffef4 = 0;
      }
      else {
        bVar2 = testAttrib((Parser *)0xa3c523);
        if (bVar2) {
          bVar1 = true;
          memset(local_78,0xaa,0x38);
          AttributeSelector::AttributeSelector
                    ((AttributeSelector *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          bVar2 = parseAttrib((Parser *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              (AttributeSelector *)in_RDI);
          if (bVar2) {
            QList<QCss::AttributeSelector>::append
                      ((QList<QCss::AttributeSelector> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (parameter_type)in_stack_fffffffffffffed8);
          }
          else {
            local_d1 = 0;
          }
          uVar4 = (uint)!bVar2;
          AttributeSelector::~AttributeSelector
                    ((AttributeSelector *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          if (uVar4 != 0) goto LAB_00a3c677;
          in_stack_fffffffffffffef4 = 0;
        }
        else {
          bVar2 = testPseudo((Parser *)0xa3c5c3);
          if (bVar2) {
            bVar1 = true;
            memset(local_b8,0xaa,0x40);
            Pseudo::Pseudo((Pseudo *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            bVar2 = parsePseudo(in_RDI,(Pseudo *)
                                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                               );
            if (bVar2) {
              QList<QCss::Pseudo>::append
                        ((QList<QCss::Pseudo> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffed8);
            }
            else {
              local_d1 = 0;
            }
            uVar4 = (uint)!bVar2;
            Pseudo::~Pseudo((Pseudo *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
            ;
            if (uVar4 != 0) goto LAB_00a3c677;
            in_stack_fffffffffffffef4 = 0;
          }
        }
      }
    }
    if (!bVar1) break;
    local_f4 = local_f4 + 1;
  }
  local_d1 = local_ec <= local_f4;
LAB_00a3c677:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_d1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseSimpleSelector(BasicSelector *basicSel)
{
    int minCount = 0;
    if (lookupElementName()) {
        if (!parseElementName(&basicSel->elementName)) return false;
    } else {
        prev();
        minCount = 1;
    }
    bool onceMore;
    int count = 0;
    do {
        onceMore = false;
        if (test(HASH)) {
            QString theid = lexem();
            // chop off leading #
            theid.remove(0, 1);
            basicSel->ids.append(theid);
            onceMore = true;
        } else if (testClass()) {
            onceMore = true;
            AttributeSelector a;
            a.name = "class"_L1;
            a.valueMatchCriterium = AttributeSelector::MatchIncludes;
            if (!parseClass(&a.value)) return false;
            basicSel->attributeSelectors.append(a);
        } else if (testAttrib()) {
            onceMore = true;
            AttributeSelector a;
            if (!parseAttrib(&a)) return false;
            basicSel->attributeSelectors.append(a);
        } else if (testPseudo()) {
            onceMore = true;
            Pseudo ps;
            if (!parsePseudo(&ps)) return false;
            basicSel->pseudos.append(ps);
        }
        if (onceMore) ++count;
    } while (onceMore);
    return count >= minCount;
}